

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extdev.c
# Opt level: O2

void envy_bios_print_extdev(envy_bios *bios,FILE *out,uint mask)

{
  byte bVar1;
  ushort uVar2;
  envy_bios_extdev_entry *peVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar2 = (bios->extdev).offset;
  if ((mask >> 0x13 & 1) == 0 || uVar2 == 0) {
    return;
  }
  bVar1 = (bios->extdev).version;
  uVar6 = (ulong)(bVar1 >> 4);
  uVar5 = (ulong)(bVar1 & 0xf);
  if ((bios->extdev).valid != '\0') {
    fprintf((FILE *)out,"EXTDEV table at 0x%04x version %d.%d",(ulong)uVar2,uVar6,uVar5);
    if (4 < (bios->extdev).hlen) {
      fprintf((FILE *)out," unk04 0x%02x",(ulong)(bios->extdev).unk04);
    }
    fputc(10,(FILE *)out);
    envy_bios_dump_hex(bios,out,(uint)(bios->extdev).offset,(uint)(bios->extdev).hlen,mask);
    for (uVar6 = 0; uVar6 < (bios->extdev).entriesnum; uVar6 = uVar6 + 1) {
      peVar3 = (bios->extdev).entries;
      if (((mask >> 0x1e & 1) != 0) || (peVar3[uVar6].type != 0xff)) {
        pcVar4 = find_enum(extdev_types,(uint)peVar3[uVar6].type);
        fprintf((FILE *)out,"EXTDEV %d:",uVar6 & 0xffffffff);
        fprintf((FILE *)out," type 0x%02x [%s]",(ulong)peVar3[uVar6].type,pcVar4);
        fprintf((FILE *)out," at 0x%02x defbus %d",(ulong)peVar3[uVar6].addr,
                (ulong)peVar3[uVar6].bus);
        if (peVar3[uVar6].unk02_0 != '\0') {
          fprintf((FILE *)out," unk02_0 %d");
        }
        if (peVar3[uVar6].unk02_5 != '\0') {
          fprintf((FILE *)out," unk02_5 %d");
        }
        if (peVar3[uVar6].unk03 != '\0') {
          fprintf((FILE *)out," unk03 0x%02x");
        }
        fputc(10,(FILE *)out);
      }
      envy_bios_dump_hex(bios,out,(uint)peVar3[uVar6].offset,(uint)(bios->extdev).rlen,mask);
    }
    fputc(10,(FILE *)out);
    return;
  }
  fprintf((FILE *)out,"Failed to parse EXTDEV table at 0x%04x version %d.%d\n\n",(ulong)uVar2,uVar6,
          uVar5);
  return;
}

Assistant:

void envy_bios_print_extdev (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_extdev *extdev = &bios->extdev;
	if (!extdev->offset || !(mask & ENVY_BIOS_PRINT_EXTDEV))
		return;
	if (!extdev->valid) {
		fprintf(out, "Failed to parse EXTDEV table at 0x%04x version %d.%d\n\n", extdev->offset, extdev->version >> 4, extdev->version & 0xf);
		return;
	}
	fprintf(out, "EXTDEV table at 0x%04x version %d.%d", extdev->offset, extdev->version >> 4, extdev->version & 0xf);
	if (extdev->hlen > 4)
		fprintf(out, " unk04 0x%02x", extdev->unk04);
	fprintf(out, "\n");
	envy_bios_dump_hex(bios, out, extdev->offset, extdev->hlen, mask);
	int i;
	for (i = 0; i < extdev->entriesnum; i++) {
		struct envy_bios_extdev_entry *entry = &extdev->entries[i];
		if (entry->type != ENVY_BIOS_EXTDEV_UNUSED || mask & ENVY_BIOS_PRINT_UNUSED) {
			const char *typename = find_enum(extdev_types, entry->type);
			fprintf(out, "EXTDEV %d:", i);
			fprintf(out, " type 0x%02x [%s]", entry->type, typename);
			fprintf(out, " at 0x%02x defbus %d", entry->addr, entry->bus);
			if (entry->unk02_0)
				fprintf(out, " unk02_0 %d", entry->unk02_0);
			if (entry->unk02_5)
				fprintf(out, " unk02_5 %d", entry->unk02_5);
			if (entry->unk03)
				fprintf(out, " unk03 0x%02x", entry->unk03);
			fprintf(out, "\n");
		}
		envy_bios_dump_hex(bios, out, entry->offset, extdev->rlen, mask);
	}
	fprintf(out, "\n");
}